

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O2

int PARMCI_AccS(int optype,void *scale,void *src_ptr,int *src_stride_arr,void *dst_ptr,
               int *dst_stride_arr,int *count,int stride_levels,int proc)

{
  int iVar1;
  long lVar2;
  
  iVar1 = armci_check_contiguous(src_stride_arr,dst_stride_arr,count,stride_levels);
  if (iVar1 == 0) {
    iVar1 = comex_accs(optype,scale,src_ptr,src_stride_arr,dst_ptr,dst_stride_arr,count,
                       stride_levels,proc,0);
  }
  else {
    iVar1 = 1;
    for (lVar2 = 0; lVar2 <= stride_levels; lVar2 = lVar2 + 1) {
      iVar1 = iVar1 * count[lVar2];
    }
    iVar1 = comex_acc(optype,scale,src_ptr,dst_ptr,iVar1,proc,0);
  }
  return iVar1;
}

Assistant:

int PARMCI_AccS(int optype, void *scale, void *src_ptr, int *src_stride_arr, void *dst_ptr, int *dst_stride_arr, int *count, int stride_levels, int proc)
{
  int iret;
  /* check if data is contiguous */
  if (armci_check_contiguous(src_stride_arr, dst_stride_arr, count, stride_levels)) {
    int i;
    int lcount = 1;
    for (i=0; i<=stride_levels; i++) lcount *= count[i];
    iret = comex_acc(optype, scale, src_ptr, dst_ptr, lcount, proc, COMEX_GROUP_WORLD);
  } else {
    iret = comex_accs(optype, scale, src_ptr, src_stride_arr, dst_ptr,
        dst_stride_arr, count, stride_levels, proc, COMEX_GROUP_WORLD);
  }
  return iret;
}